

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

void nonce_load_hex(uint8_t *nonce,char *hex)

{
  int iVar1;
  size_t sVar2;
  char *hex_local;
  uint8_t *nonce_local;
  
  if ((nonce != (uint8_t *)0x0) && (hex != (char *)0x0)) {
    sVar2 = strlen(hex);
    if (sVar2 == 0x30) {
      sVar2 = strlen(hex);
      iVar1 = sodium_hex2bin(nonce,0x18,hex,sVar2,0,0,0);
      if (iVar1 == 0) {
        return;
      }
      __assert_fail("sodium_hex2bin(nonce, paseto_v2_LOCAL_NONCEBYTES, hex, strlen(hex), NULL, NULL, NULL) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/helpers.c"
                    ,0x11,"void nonce_load_hex(uint8_t *, const char *)");
    }
  }
  fprintf(_stderr,"nonce_load_hex called with invalid hex string length or null pointer");
  abort();
}

Assistant:

void nonce_load_hex(
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES], const char *hex) {
    if (!nonce || !hex || strlen(hex) != 2 * paseto_v2_LOCAL_NONCEBYTES) {
        fprintf(stderr, "nonce_load_hex called with invalid hex string length "
                        "or null pointer");
        abort();
    }
    assert(sodium_hex2bin(nonce, paseto_v2_LOCAL_NONCEBYTES, hex, strlen(hex),
            NULL, NULL, NULL) == 0);
}